

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_ParseMoney::test_method(util_ParseMoney *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  _Storage<long,_true> *p_Var3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  optional<long> oVar5;
  char **ppcVar6;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  allocator<char> local_c1;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  _Storage<long,_true> local_90;
  char *local_88;
  shared_count sStack_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x17b;
  file.m_begin = (iterator)&local_a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b0,msg);
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"0.0",&local_c1);
  oVar5 = ParseMoney((string *)local_78);
  local_90._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  bVar1 = oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
          ._M_engaged;
  local_88._0_1_ = bVar1;
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_668 = (char *)((ulong)local_668 & 0xffffffff00000000);
    pvVar2 = (iterator)0x2;
    p_Var3 = &local_90;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_58,&local_c0,0x17b,1,2,p_Var3,"ParseMoney(\"0.0\").value()",&local_668,"0");
    std::__cxx11::string::~string((string *)local_78);
    local_d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)p_Var3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = (iterator)0x17c;
    file_00.m_begin = (iterator)&local_d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,
               msg_00);
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01139f30;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
    local_f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_f0 = "";
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,".",&local_c1);
    oVar5 = ParseMoney((string *)local_78);
    local_90._M_value =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_88._0_1_ =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_engaged;
    if (((undefined1  [16])
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_668 = (char *)((ulong)local_668 & 0xffffffff00000000);
      pvVar2 = (iterator)0x2;
      p_Var3 = &local_90;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                (local_58,&local_f8,0x17c,1,2,p_Var3,"ParseMoney(\".\").value()",&local_668,"0");
      std::__cxx11::string::~string((string *)local_78);
      local_108 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_100 = "";
      local_118 = &boost::unit_test::basic_cstring<char_const>::null;
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = (iterator)p_Var3;
      msg_01.m_begin = pvVar2;
      file_01.m_end = (iterator)0x17d;
      file_01.m_begin = (iterator)&local_108;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
                 msg_01);
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_01139f30;
      local_48 = boost::unit_test::lazy_ostream::inst;
      local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
      local_128 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_120 = "";
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"0.",&local_c1);
      oVar5 = ParseMoney((string *)local_78);
      local_90._M_value =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_88._0_1_ =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged;
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        local_668 = (char *)((ulong)local_668 & 0xffffffff00000000);
        pvVar2 = (iterator)0x2;
        p_Var3 = &local_90;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                  (local_58,&local_128,0x17d,1,2,p_Var3,"ParseMoney(\"0.\").value()",&local_668,"0")
        ;
        std::__cxx11::string::~string((string *)local_78);
        local_138 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_130 = "";
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        local_140 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_02.m_end = (iterator)p_Var3;
        msg_02.m_begin = pvVar2;
        file_02.m_end = (iterator)0x17e;
        file_02.m_begin = (iterator)&local_138;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_148
                   ,msg_02);
        local_58[8] = false;
        local_58._0_8_ = &PTR__lazy_ostream_01139f30;
        local_48 = boost::unit_test::lazy_ostream::inst;
        local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
        local_158 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_150 = "";
        std::__cxx11::string::string<std::allocator<char>>((string *)local_78,".0",&local_c1);
        oVar5 = ParseMoney((string *)local_78);
        local_90._M_value =
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        local_88._0_1_ =
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        if (((undefined1  [16])
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          local_668 = (char *)((ulong)local_668 & 0xffffffff00000000);
          pvVar2 = (iterator)0x2;
          p_Var3 = &local_90;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    (local_58,&local_158,0x17e,1,2,p_Var3,"ParseMoney(\".0\").value()",&local_668,
                     "0");
          std::__cxx11::string::~string((string *)local_78);
          local_168 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_160 = "";
          local_178 = &boost::unit_test::basic_cstring<char_const>::null;
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_03.m_end = (iterator)p_Var3;
          msg_03.m_begin = pvVar2;
          file_03.m_end = (iterator)0x17f;
          file_03.m_begin = (iterator)&local_168;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_178,msg_03);
          local_58[8] = false;
          local_58._0_8_ = &PTR__lazy_ostream_01139f30;
          local_48 = boost::unit_test::lazy_ostream::inst;
          local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
          local_188 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_180 = "";
          std::__cxx11::string::string<std::allocator<char>>((string *)local_78,".6789",&local_c1);
          oVar5 = ParseMoney((string *)local_78);
          local_90._M_value =
               oVar5.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          local_88._0_1_ =
               oVar5.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
          if (((undefined1  [16])
               oVar5.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_668 = (char *)CONCAT44(local_668._4_4_,0x40beb50);
            pvVar2 = (iterator)0x2;
            p_Var3 = &local_90;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                      (local_58,&local_188,0x17f,1,2,p_Var3,"ParseMoney(\".6789\").value()",
                       &local_668,"6789\'0000");
            std::__cxx11::string::~string((string *)local_78);
            local_198 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_190 = "";
            local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_04.m_end = (iterator)p_Var3;
            msg_04.m_begin = pvVar2;
            file_04.m_end = (iterator)0x180;
            file_04.m_begin = (iterator)&local_198;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                       (size_t)&local_1a8,msg_04);
            local_58[8] = false;
            local_58._0_8_ = &PTR__lazy_ostream_01139f30;
            local_48 = boost::unit_test::lazy_ostream::inst;
            local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
            local_1b8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_1b0 = "";
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_78,"12345.",&local_c1);
            oVar5 = ParseMoney((string *)local_78);
            local_90._M_value =
                 oVar5.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload;
            local_88._0_1_ =
                 oVar5.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged;
            if (((undefined1  [16])
                 oVar5.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              local_668 = (char *)0x11f6def1900;
              pvVar2 = (iterator)0x2;
              p_Var3 = &local_90;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                        (local_58,&local_1b8,0x180,1,2,p_Var3,"ParseMoney(\"12345.\").value()",
                         &local_668,"COIN * 12345");
              std::__cxx11::string::~string((string *)local_78);
              local_1c8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_1c0 = "";
              local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_05.m_end = (iterator)p_Var3;
              msg_05.m_begin = pvVar2;
              file_05.m_end = (iterator)0x182;
              file_05.m_begin = (iterator)&local_1c8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                         (size_t)&local_1d8,msg_05);
              local_58[8] = false;
              local_58._0_8_ = &PTR__lazy_ostream_01139f30;
              local_48 = boost::unit_test::lazy_ostream::inst;
              local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
              local_1e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_1e0 = "";
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_78,"12345.6789",&local_c1);
              oVar5 = ParseMoney((string *)local_78);
              local_90._M_value =
                   oVar5.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
              local_88._0_1_ =
                   oVar5.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_engaged;
              if (((undefined1  [16])
                   oVar5.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                local_668 = (char *)0x11f71fb0450;
                pvVar2 = (iterator)0x2;
                p_Var3 = &local_90;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                          (local_58,&local_1e8,0x182,1,2,p_Var3,"ParseMoney(\"12345.6789\").value()"
                           ,&local_668,"(COIN/10000)*123456789");
                std::__cxx11::string::~string((string *)local_78);
                local_1f8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_1f0 = "";
                local_208 = &boost::unit_test::basic_cstring<char_const>::null;
                local_200 = &boost::unit_test::basic_cstring<char_const>::null;
                msg_06.m_end = (iterator)p_Var3;
                msg_06.m_begin = pvVar2;
                file_06.m_end = (iterator)0x184;
                file_06.m_begin = (iterator)&local_1f8;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                           (size_t)&local_208,msg_06);
                local_58[8] = false;
                local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                local_48 = boost::unit_test::lazy_ostream::inst;
                local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                local_218 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_210 = "";
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_78,"10000000.00",&local_c1);
                oVar5 = ParseMoney((string *)local_78);
                local_90._M_value =
                     oVar5.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                local_88._0_1_ =
                     oVar5.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
                if (((undefined1  [16])
                     oVar5.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  local_668 = (char *)0x38d7ea4c68000;
                  pvVar2 = (iterator)0x2;
                  p_Var3 = &local_90;
                  boost::test_tools::tt_detail::
                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                            (local_58,&local_218,0x184,1,2,p_Var3,
                             "ParseMoney(\"10000000.00\").value()",&local_668,"COIN*10000000");
                  std::__cxx11::string::~string((string *)local_78);
                  local_228 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_220 = "";
                  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
                  msg_07.m_end = (iterator)p_Var3;
                  msg_07.m_begin = pvVar2;
                  file_07.m_end = (iterator)0x185;
                  file_07.m_begin = (iterator)&local_228;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                             (size_t)&local_238,msg_07);
                  local_58[8] = false;
                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                  local_48 = boost::unit_test::lazy_ostream::inst;
                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                  local_248 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_240 = "";
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_78,"1000000.00",&local_c1);
                  oVar5 = ParseMoney((string *)local_78);
                  local_90._M_value =
                       oVar5.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_payload;
                  local_88._0_1_ =
                       oVar5.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_engaged;
                  if (((undefined1  [16])
                       oVar5.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    local_668 = (char *)0x5af3107a4000;
                    pvVar2 = (iterator)0x2;
                    p_Var3 = &local_90;
                    boost::test_tools::tt_detail::
                    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                              (local_58,&local_248,0x185,1,2,p_Var3,
                               "ParseMoney(\"1000000.00\").value()",&local_668,"COIN*1000000");
                    std::__cxx11::string::~string((string *)local_78);
                    local_258 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_250 = "";
                    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
                    msg_08.m_end = (iterator)p_Var3;
                    msg_08.m_begin = pvVar2;
                    file_08.m_end = (iterator)0x186;
                    file_08.m_begin = (iterator)&local_258;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                               (size_t)&local_268,msg_08);
                    local_58[8] = false;
                    local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                    local_48 = boost::unit_test::lazy_ostream::inst;
                    local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                    local_278 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_270 = "";
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_78,"100000.00",&local_c1);
                    oVar5 = ParseMoney((string *)local_78);
                    local_90._M_value =
                         oVar5.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload;
                    local_88._0_1_ =
                         oVar5.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_engaged;
                    if (((undefined1  [16])
                         oVar5.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      local_668 = (char *)0x9184e72a000;
                      pvVar2 = (iterator)0x2;
                      p_Var3 = &local_90;
                      boost::test_tools::tt_detail::
                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                (local_58,&local_278,0x186,1,2,p_Var3,
                                 "ParseMoney(\"100000.00\").value()",&local_668,"COIN*100000");
                      std::__cxx11::string::~string((string *)local_78);
                      local_288 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_280 = "";
                      local_298 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_290 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg_09.m_end = (iterator)p_Var3;
                      msg_09.m_begin = pvVar2;
                      file_09.m_end = (iterator)0x187;
                      file_09.m_begin = (iterator)&local_288;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                                 (size_t)&local_298,msg_09);
                      local_58[8] = false;
                      local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                      local_48 = boost::unit_test::lazy_ostream::inst;
                      local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                      local_2a8 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_2a0 = "";
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_78,"10000.00",&local_c1);
                      oVar5 = ParseMoney((string *)local_78);
                      local_90._M_value =
                           oVar5.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_payload;
                      local_88._0_1_ =
                           oVar5.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_engaged;
                      if (((undefined1  [16])
                           oVar5.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                          (undefined1  [16])0x0) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        local_668 = (char *)0xe8d4a51000;
                        pvVar2 = (iterator)0x2;
                        p_Var3 = &local_90;
                        boost::test_tools::tt_detail::
                        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                  (local_58,&local_2a8,0x187,1,2,p_Var3,
                                   "ParseMoney(\"10000.00\").value()",&local_668,"COIN*10000");
                        std::__cxx11::string::~string((string *)local_78);
                        local_2b8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2b0 = "";
                        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_10.m_end = (iterator)p_Var3;
                        msg_10.m_begin = pvVar2;
                        file_10.m_end = (iterator)0x188;
                        file_10.m_begin = (iterator)&local_2b8;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                                   (size_t)&local_2c8,msg_10);
                        local_58[8] = false;
                        local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                        local_48 = boost::unit_test::lazy_ostream::inst;
                        local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                        local_2d8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2d0 = "";
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_78,"1000.00",&local_c1);
                        oVar5 = ParseMoney((string *)local_78);
                        local_90._M_value =
                             oVar5.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_payload;
                        local_88._0_1_ =
                             oVar5.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_engaged;
                        if (((undefined1  [16])
                             oVar5.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          local_668 = (char *)0x174876e800;
                          pvVar2 = (iterator)0x2;
                          p_Var3 = &local_90;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                    (local_58,&local_2d8,0x188,1,2,p_Var3,
                                     "ParseMoney(\"1000.00\").value()",&local_668,"COIN*1000");
                          std::__cxx11::string::~string((string *)local_78);
                          local_2e8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_2e0 = "";
                          local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_11.m_end = (iterator)p_Var3;
                          msg_11.m_begin = pvVar2;
                          file_11.m_end = (iterator)0x189;
                          file_11.m_begin = (iterator)&local_2e8;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                                     (size_t)&local_2f8,msg_11);
                          local_58[8] = false;
                          local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                          local_48 = boost::unit_test::lazy_ostream::inst;
                          local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                          local_308 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_300 = "";
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_78,"100.00",&local_c1);
                          oVar5 = ParseMoney((string *)local_78);
                          local_90._M_value =
                               oVar5.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_payload;
                          local_88._0_1_ =
                               oVar5.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_engaged;
                          if (((undefined1  [16])
                               oVar5.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) {
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              std::__throw_bad_optional_access();
                            }
                          }
                          else {
                            local_668 = (char *)0x2540be400;
                            pvVar2 = (iterator)0x2;
                            p_Var3 = &local_90;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (local_58,&local_308,0x189,1,2,p_Var3,
                                       "ParseMoney(\"100.00\").value()",&local_668,"COIN*100");
                            std::__cxx11::string::~string((string *)local_78);
                            local_318 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                            ;
                            local_310 = "";
                            local_328 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_320 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_12.m_end = (iterator)p_Var3;
                            msg_12.m_begin = pvVar2;
                            file_12.m_end = (iterator)0x18a;
                            file_12.m_begin = (iterator)&local_318;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_12,(size_t)&local_328,msg_12);
                            local_58[8] = false;
                            local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                            local_48 = boost::unit_test::lazy_ostream::inst;
                            local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                            local_338 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                            ;
                            local_330 = "";
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_78,"10.00",&local_c1);
                            oVar5 = ParseMoney((string *)local_78);
                            local_90._M_value =
                                 oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long>._M_payload;
                            local_88._0_1_ =
                                 oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long>._M_engaged;
                            if (((undefined1  [16])
                                 oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                                (undefined1  [16])0x0) {
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                std::__throw_bad_optional_access();
                              }
                            }
                            else {
                              local_668 = &DAT_3b9aca00;
                              pvVar2 = (iterator)0x2;
                              p_Var3 = &local_90;
                              boost::test_tools::tt_detail::
                              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                        (local_58,&local_338,0x18a,1,2,p_Var3,
                                         "ParseMoney(\"10.00\").value()",&local_668,"COIN*10");
                              std::__cxx11::string::~string((string *)local_78);
                              local_348 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                              ;
                              local_340 = "";
                              local_358 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_350 = &boost::unit_test::basic_cstring<char_const>::null;
                              msg_13.m_end = (iterator)p_Var3;
                              msg_13.m_begin = pvVar2;
                              file_13.m_end = (iterator)0x18b;
                              file_13.m_begin = (iterator)&local_348;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_13,(size_t)&local_358,msg_13);
                              local_58[8] = false;
                              local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                              local_48 = boost::unit_test::lazy_ostream::inst;
                              local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                              local_368 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                              ;
                              local_360 = "";
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_78,"1.00",(allocator<char> *)&local_668);
                              oVar5 = ParseMoney((string *)local_78);
                              local_90._M_value =
                                   oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                   super__Optional_payload_base<long>._M_payload;
                              local_88._0_1_ =
                                   oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                   super__Optional_payload_base<long>._M_engaged;
                              if (((undefined1  [16])
                                   oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                   super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) {
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  std::__throw_bad_optional_access();
                                }
                              }
                              else {
                                pvVar2 = (iterator)0x2;
                                p_Var3 = &local_90;
                                boost::test_tools::tt_detail::
                                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                          (local_58,&local_368,0x18b,1,2,p_Var3,
                                           "ParseMoney(\"1.00\").value()",&COIN,"COIN");
                                std::__cxx11::string::~string((string *)local_78);
                                local_378 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                ;
                                local_370 = "";
                                local_388 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_380 = &boost::unit_test::basic_cstring<char_const>::null;
                                msg_14.m_end = (iterator)p_Var3;
                                msg_14.m_begin = pvVar2;
                                file_14.m_end = (iterator)0x18c;
                                file_14.m_begin = (iterator)&local_378;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_14,(size_t)&local_388,msg_14);
                                local_58[8] = false;
                                local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                local_48 = boost::unit_test::lazy_ostream::inst;
                                local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                local_398 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                ;
                                local_390 = "";
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_78,"1",(allocator<char> *)&local_668);
                                oVar5 = ParseMoney((string *)local_78);
                                local_90._M_value =
                                     oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                     super__Optional_payload_base<long>._M_payload;
                                local_88._0_1_ =
                                     oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                     super__Optional_payload_base<long>._M_engaged;
                                if (((undefined1  [16])
                                     oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                     super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) {
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    std::__throw_bad_optional_access();
                                  }
                                }
                                else {
                                  pvVar2 = (iterator)0x2;
                                  p_Var3 = &local_90;
                                  boost::test_tools::tt_detail::
                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                            (local_58,&local_398,0x18c,1,2,p_Var3,
                                             "ParseMoney(\"1\").value()",&COIN,"COIN");
                                  std::__cxx11::string::~string((string *)local_78);
                                  local_3a8 = 
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                  ;
                                  local_3a0 = "";
                                  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
                                  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
                                  msg_15.m_end = (iterator)p_Var3;
                                  msg_15.m_begin = pvVar2;
                                  file_15.m_end = (iterator)0x18d;
                                  file_15.m_begin = (iterator)&local_3a8;
                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                            (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                             file_15,(size_t)&local_3b8,msg_15);
                                  local_58[8] = false;
                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                  local_3c8 = 
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                  ;
                                  local_3c0 = "";
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_78,"   1",(allocator<char> *)&local_668
                                            );
                                  oVar5 = ParseMoney((string *)local_78);
                                  local_90._M_value =
                                       oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>._M_payload;
                                  local_88._0_1_ =
                                       oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>._M_engaged;
                                  if (((undefined1  [16])
                                       oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long> & (undefined1  [16])0x1)
                                      == (undefined1  [16])0x0) {
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      std::__throw_bad_optional_access();
                                    }
                                  }
                                  else {
                                    pvVar2 = (iterator)0x2;
                                    p_Var3 = &local_90;
                                    boost::test_tools::tt_detail::
                                    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                              (local_58,&local_3c8,0x18d,1,2,p_Var3,
                                               "ParseMoney(\"   1\").value()",&COIN,"COIN");
                                    std::__cxx11::string::~string((string *)local_78);
                                    local_3d8 = 
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                    ;
                                    local_3d0 = "";
                                    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
                                    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
                                    msg_16.m_end = (iterator)p_Var3;
                                    msg_16.m_begin = pvVar2;
                                    file_16.m_end = (iterator)0x18e;
                                    file_16.m_begin = (iterator)&local_3d8;
                                    boost::unit_test::unit_test_log_t::set_checkpoint
                                              (boost::unit_test::(anonymous_namespace)::
                                               unit_test_log,file_16,(size_t)&local_3e8,msg_16);
                                    local_58[8] = false;
                                    local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                    local_48 = boost::unit_test::lazy_ostream::inst;
                                    local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                    local_3f8 = 
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                    ;
                                    local_3f0 = "";
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)local_78,"1   ",
                                               (allocator<char> *)&local_668);
                                    oVar5 = ParseMoney((string *)local_78);
                                    local_90._M_value =
                                         oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                         super__Optional_payload_base<long>._M_payload;
                                    local_88._0_1_ =
                                         oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                         super__Optional_payload_base<long>._M_engaged;
                                    if (((undefined1  [16])
                                         oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                         super__Optional_payload_base<long> & (undefined1  [16])0x1)
                                        == (undefined1  [16])0x0) {
                                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                        std::__throw_bad_optional_access();
                                      }
                                    }
                                    else {
                                      pvVar2 = (iterator)0x2;
                                      p_Var3 = &local_90;
                                      boost::test_tools::tt_detail::
                                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                (local_58,&local_3f8,0x18e,1,2,p_Var3,
                                                 "ParseMoney(\"1   \").value()",&COIN,"COIN");
                                      std::__cxx11::string::~string((string *)local_78);
                                      local_408 = 
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                      ;
                                      local_400 = "";
                                      local_418 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_410 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      msg_17.m_end = (iterator)p_Var3;
                                      msg_17.m_begin = pvVar2;
                                      file_17.m_end = (iterator)0x18f;
                                      file_17.m_begin = (iterator)&local_408;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,file_17,(size_t)&local_418,msg_17);
                                      local_58[8] = false;
                                      local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                      local_48 = boost::unit_test::lazy_ostream::inst;
                                      local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                      local_428 = 
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                      ;
                                      local_420 = "";
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_78,"  1 ",
                                                 (allocator<char> *)&local_668);
                                      oVar5 = ParseMoney((string *)local_78);
                                      local_90._M_value =
                                           oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                           super__Optional_payload_base<long>._M_payload;
                                      local_88._0_1_ =
                                           oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                           super__Optional_payload_base<long>._M_engaged;
                                      if (((undefined1  [16])
                                           oVar5.super__Optional_base<long,_true,_true>._M_payload.
                                           super__Optional_payload_base<long> &
                                          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                          std::__throw_bad_optional_access();
                                        }
                                      }
                                      else {
                                        pvVar2 = (iterator)0x2;
                                        p_Var3 = &local_90;
                                        boost::test_tools::tt_detail::
                                        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                  (local_58,&local_428,399,1,2,p_Var3,
                                                   "ParseMoney(\"  1 \").value()",&COIN,"COIN");
                                        std::__cxx11::string::~string((string *)local_78);
                                        local_438 = 
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                        ;
                                        local_430 = "";
                                        local_448 = &boost::unit_test::basic_cstring<char_const>::
                                                     null;
                                        local_440 = &boost::unit_test::basic_cstring<char_const>::
                                                     null;
                                        msg_18.m_end = (iterator)p_Var3;
                                        msg_18.m_begin = pvVar2;
                                        file_18.m_end = (iterator)0x190;
                                        file_18.m_begin = (iterator)&local_438;
                                        boost::unit_test::unit_test_log_t::set_checkpoint
                                                  (boost::unit_test::(anonymous_namespace)::
                                                   unit_test_log,file_18,(size_t)&local_448,msg_18);
                                        local_58[8] = false;
                                        local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                        local_48 = boost::unit_test::lazy_ostream::inst;
                                        local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                        local_458 = 
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                        ;
                                        local_450 = "";
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)local_78,"0.1",&local_c1);
                                        oVar5 = ParseMoney((string *)local_78);
                                        local_90._M_value =
                                             oVar5.super__Optional_base<long,_true,_true>._M_payload
                                             .super__Optional_payload_base<long>._M_payload;
                                        local_88._0_1_ =
                                             oVar5.super__Optional_base<long,_true,_true>._M_payload
                                             .super__Optional_payload_base<long>._M_engaged;
                                        if (((undefined1  [16])
                                             oVar5.super__Optional_base<long,_true,_true>._M_payload
                                             .super__Optional_payload_base<long> &
                                            (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                            std::__throw_bad_optional_access();
                                          }
                                        }
                                        else {
                                          local_668 = (char *)0x989680;
                                          pvVar2 = (iterator)0x2;
                                          p_Var3 = &local_90;
                                          boost::test_tools::tt_detail::
                                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                    (local_58,&local_458,400,1,2,p_Var3,
                                                     "ParseMoney(\"0.1\").value()",&local_668,
                                                     "COIN/10");
                                          std::__cxx11::string::~string((string *)local_78);
                                          local_468 = 
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                          ;
                                          local_460 = "";
                                          local_478 = &boost::unit_test::basic_cstring<char_const>::
                                                       null;
                                          local_470 = &boost::unit_test::basic_cstring<char_const>::
                                                       null;
                                          msg_19.m_end = (iterator)p_Var3;
                                          msg_19.m_begin = pvVar2;
                                          file_19.m_end = (iterator)0x191;
                                          file_19.m_begin = (iterator)&local_468;
                                          boost::unit_test::unit_test_log_t::set_checkpoint
                                                    (boost::unit_test::(anonymous_namespace)::
                                                     unit_test_log,file_19,(size_t)&local_478,msg_19
                                                    );
                                          local_58[8] = false;
                                          local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                          local_48 = boost::unit_test::lazy_ostream::inst;
                                          local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                          local_488 = 
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                          ;
                                          local_480 = "";
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)local_78,"0.01",&local_c1);
                                          oVar5 = ParseMoney((string *)local_78);
                                          local_90._M_value =
                                               oVar5.super__Optional_base<long,_true,_true>.
                                               _M_payload.super__Optional_payload_base<long>.
                                               _M_payload;
                                          local_88._0_1_ =
                                               oVar5.super__Optional_base<long,_true,_true>.
                                               _M_payload.super__Optional_payload_base<long>.
                                               _M_engaged;
                                          if (((undefined1  [16])
                                               oVar5.super__Optional_base<long,_true,_true>.
                                               _M_payload.super__Optional_payload_base<long> &
                                              (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                              std::__throw_bad_optional_access();
                                            }
                                          }
                                          else {
                                            local_668 = (char *)0xf4240;
                                            pvVar2 = (iterator)0x2;
                                            p_Var3 = &local_90;
                                            boost::test_tools::tt_detail::
                                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                      (local_58,&local_488,0x191,1,2,p_Var3,
                                                       "ParseMoney(\"0.01\").value()",&local_668,
                                                       "COIN/100");
                                            std::__cxx11::string::~string((string *)local_78);
                                            local_498 = 
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                            ;
                                            local_490 = "";
                                            local_4a8 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_4a0 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            msg_20.m_end = (iterator)p_Var3;
                                            msg_20.m_begin = pvVar2;
                                            file_20.m_end = (iterator)0x192;
                                            file_20.m_begin = (iterator)&local_498;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,file_20,(size_t)&local_4a8,
                                                       msg_20);
                                            local_58[8] = false;
                                            local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                            local_48 = boost::unit_test::lazy_ostream::inst;
                                            local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                            local_4b8 = 
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                            ;
                                            local_4b0 = "";
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)local_78,"0.001",&local_c1);
                                            oVar5 = ParseMoney((string *)local_78);
                                            local_90._M_value =
                                                 oVar5.super__Optional_base<long,_true,_true>.
                                                 _M_payload.super__Optional_payload_base<long>.
                                                 _M_payload;
                                            local_88._0_1_ =
                                                 oVar5.super__Optional_base<long,_true,_true>.
                                                 _M_payload.super__Optional_payload_base<long>.
                                                 _M_engaged;
                                            if (((undefined1  [16])
                                                 oVar5.super__Optional_base<long,_true,_true>.
                                                 _M_payload.super__Optional_payload_base<long> &
                                                (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                std::__throw_bad_optional_access();
                                              }
                                            }
                                            else {
                                              local_668 = (char *)0x186a0;
                                              pvVar2 = (iterator)0x2;
                                              p_Var3 = &local_90;
                                              boost::test_tools::tt_detail::
                                              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                        (local_58,&local_4b8,0x192,1,2,p_Var3,
                                                         "ParseMoney(\"0.001\").value()",&local_668,
                                                         "COIN/1000");
                                              std::__cxx11::string::~string((string *)local_78);
                                              local_4c8 = 
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                              ;
                                              local_4c0 = "";
                                              local_4d8 = &boost::unit_test::
                                                           basic_cstring<char_const>::null;
                                              local_4d0 = &boost::unit_test::
                                                           basic_cstring<char_const>::null;
                                              msg_21.m_end = (iterator)p_Var3;
                                              msg_21.m_begin = pvVar2;
                                              file_21.m_end = (iterator)0x193;
                                              file_21.m_begin = (iterator)&local_4c8;
                                              boost::unit_test::unit_test_log_t::set_checkpoint
                                                        (boost::unit_test::(anonymous_namespace)::
                                                         unit_test_log,file_21,(size_t)&local_4d8,
                                                         msg_21);
                                              local_58[8] = false;
                                              local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                              local_48 = boost::unit_test::lazy_ostream::inst;
                                              local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                              local_4e8 = 
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                              ;
                                              local_4e0 = "";
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)local_78,"0.0001",&local_c1);
                                              oVar5 = ParseMoney((string *)local_78);
                                              local_90._M_value =
                                                   oVar5.super__Optional_base<long,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<long>.
                                                   _M_payload;
                                              local_88._0_1_ =
                                                   oVar5.super__Optional_base<long,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<long>.
                                                   _M_engaged;
                                              if (((undefined1  [16])
                                                   oVar5.super__Optional_base<long,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<long> &
                                                  (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                  std::__throw_bad_optional_access();
                                                }
                                              }
                                              else {
                                                local_668 = (char *)0x2710;
                                                pvVar2 = (iterator)0x2;
                                                p_Var3 = &local_90;
                                                boost::test_tools::tt_detail::
                                                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                          (local_58,&local_4e8,0x193,1,2,p_Var3,
                                                           "ParseMoney(\"0.0001\").value()",
                                                           &local_668,"COIN/10000");
                                                std::__cxx11::string::~string((string *)local_78);
                                                local_4f8 = 
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                ;
                                                local_4f0 = "";
                                                local_508 = &boost::unit_test::
                                                             basic_cstring<char_const>::null;
                                                local_500 = &boost::unit_test::
                                                             basic_cstring<char_const>::null;
                                                msg_22.m_end = (iterator)p_Var3;
                                                msg_22.m_begin = pvVar2;
                                                file_22.m_end = (iterator)0x194;
                                                file_22.m_begin = (iterator)&local_4f8;
                                                boost::unit_test::unit_test_log_t::set_checkpoint
                                                          (boost::unit_test::(anonymous_namespace)::
                                                           unit_test_log,file_22,(size_t)&local_508,
                                                           msg_22);
                                                local_58[8] = false;
                                                local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                local_48 = boost::unit_test::lazy_ostream::inst;
                                                local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                local_518 = 
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                ;
                                                local_510 = "";
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)local_78,"0.00001",&local_c1);
                                                oVar5 = ParseMoney((string *)local_78);
                                                local_90._M_value =
                                                     oVar5.super__Optional_base<long,_true,_true>.
                                                     _M_payload.super__Optional_payload_base<long>.
                                                     _M_payload;
                                                local_88._0_1_ =
                                                     oVar5.super__Optional_base<long,_true,_true>.
                                                     _M_payload.super__Optional_payload_base<long>.
                                                     _M_engaged;
                                                if (((undefined1  [16])
                                                     oVar5.super__Optional_base<long,_true,_true>.
                                                     _M_payload.super__Optional_payload_base<long> &
                                                    (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                                {
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                    std::__throw_bad_optional_access();
                                                  }
                                                }
                                                else {
                                                  local_668 = (char *)0x3e8;
                                                  pvVar2 = (iterator)0x2;
                                                  p_Var3 = &local_90;
                                                  boost::test_tools::tt_detail::
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_518,0x194,1,2,p_Var3,
                                                             "ParseMoney(\"0.00001\").value()",
                                                             &local_668,"COIN/100000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_528 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_520 = "";
                                                  local_538 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_530 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_23.m_end = (iterator)p_Var3;
                                                  msg_23.m_begin = pvVar2;
                                                  file_23.m_end = (iterator)0x195;
                                                  file_23.m_begin = (iterator)&local_528;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_23,
                                                             (size_t)&local_538,msg_23);
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                  local_548 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_540 = "";
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_78,"0.000001",&local_c1
                                                            );
                                                  oVar5 = ParseMoney((string *)local_78);
                                                  local_90._M_value =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_88._0_1_ =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_668 = (char *)0x64;
                                                    pvVar2 = (iterator)0x2;
                                                    p_Var3 = &local_90;
                                                    boost::test_tools::tt_detail::
                                                                                                        
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_548,0x195,1,2,p_Var3,
                                                             "ParseMoney(\"0.000001\").value()",
                                                             &local_668,"COIN/1000000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_558 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_550 = "";
                                                  local_568 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_560 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_24.m_end = (iterator)p_Var3;
                                                  msg_24.m_begin = pvVar2;
                                                  file_24.m_end = (iterator)0x196;
                                                  file_24.m_begin = (iterator)&local_558;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_24,
                                                             (size_t)&local_568,msg_24);
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                  local_578 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_570 = "";
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_78,"0.0000001",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_78);
                                                  local_90._M_value =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_88._0_1_ =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_668 = (char *)0xa;
                                                    pvVar2 = (iterator)0x2;
                                                    p_Var3 = &local_90;
                                                    boost::test_tools::tt_detail::
                                                                                                        
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_578,0x196,1,2,p_Var3,
                                                             "ParseMoney(\"0.0000001\").value()",
                                                             &local_668,"COIN/10000000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_588 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_580 = "";
                                                  local_598 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_590 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_25.m_end = (iterator)p_Var3;
                                                  msg_25.m_begin = pvVar2;
                                                  file_25.m_end = (iterator)0x197;
                                                  file_25.m_begin = (iterator)&local_588;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_25,
                                                             (size_t)&local_598,msg_25);
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                  local_5a8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5a0 = "";
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_78,"0.00000001",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_78);
                                                  local_90._M_value =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_88._0_1_ =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_668 = (char *)0x1;
                                                    pvVar2 = (iterator)0x2;
                                                    p_Var3 = &local_90;
                                                    boost::test_tools::tt_detail::
                                                                                                        
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_5a8,0x197,1,2,p_Var3,
                                                             "ParseMoney(\"0.00000001\").value()",
                                                             &local_668,"COIN/100000000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_5b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5b0 = "";
                                                  local_5c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_5c0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_26.m_end = (iterator)p_Var3;
                                                  msg_26.m_begin = pvVar2;
                                                  file_26.m_end = (iterator)0x198;
                                                  file_26.m_begin = (iterator)&local_5b8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_26,
                                                             (size_t)&local_5c8,msg_26);
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                  local_5d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5d0 = "";
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_78," 0.00000001 ",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_78);
                                                  local_90._M_value =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_88._0_1_ =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_668 = (char *)0x1;
                                                    pvVar2 = (iterator)0x2;
                                                    p_Var3 = &local_90;
                                                    boost::test_tools::tt_detail::
                                                                                                        
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_5d8,0x198,1,2,p_Var3,
                                                             "ParseMoney(\" 0.00000001 \").value()",
                                                             &local_668,"COIN/100000000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_5e8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5e0 = "";
                                                  local_5f8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_5f0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_27.m_end = (iterator)p_Var3;
                                                  msg_27.m_begin = pvVar2;
                                                  file_27.m_end = (iterator)0x199;
                                                  file_27.m_begin = (iterator)&local_5e8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_27,
                                                             (size_t)&local_5f8,msg_27);
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                  local_608 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_600 = "";
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_78,"0.00000001 ",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_78);
                                                  local_90._M_value =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_88._0_1_ =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_668 = (char *)0x1;
                                                    pvVar2 = (iterator)0x2;
                                                    p_Var3 = &local_90;
                                                    boost::test_tools::tt_detail::
                                                                                                        
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_608,0x199,1,2,p_Var3,
                                                             "ParseMoney(\"0.00000001 \").value()",
                                                             &local_668,"COIN/100000000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_618 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_610 = "";
                                                  local_628 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_620 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_28.m_end = (iterator)p_Var3;
                                                  msg_28.m_begin = pvVar2;
                                                  file_28.m_end = (iterator)0x19a;
                                                  file_28.m_begin = (iterator)&local_618;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_28,
                                                             (size_t)&local_628,msg_28);
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = (long)"\x05\x04\x03\x02\x01" + 5;
                                                  local_638 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_630 = "";
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_78," 0.00000001",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_78);
                                                  local_90._M_value =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_88._0_1_ =
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar5.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_668 = (char *)0x1;
                                                    ppcVar6 = &local_668;
                                                    pvVar2 = (iterator)0x2;
                                                    p_Var3 = &local_90;
                                                    boost::test_tools::tt_detail::
                                                                                                        
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                                            (local_58,&local_638,0x19a,1,2,p_Var3,
                                                             "ParseMoney(\" 0.00000001\").value()",
                                                             ppcVar6,"COIN/100000000");
                                                  std::__cxx11::string::~string((string *)local_78);
                                                  local_648 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_640 = "";
                                                  local_658 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_650 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_29.m_end = (iterator)p_Var3;
                                                  msg_29.m_begin = pvVar2;
                                                  file_29.m_end = (iterator)0x19d;
                                                  file_29.m_begin = (iterator)&local_648;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_29,
                                                             (size_t)&local_658,msg_29);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"100000000.00",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"100000000.00\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_678 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_670 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_678,
                                                             0x19d);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_688 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_680 = "";
                                                  local_698 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_690 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_30.m_end = pvVar4;
                                                  msg_30.m_begin = pvVar2;
                                                  file_30.m_end = (iterator)0x19e;
                                                  file_30.m_begin = (iterator)&local_688;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_30,
                                                             (size_t)&local_698,msg_30);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"0.000000001",
                                                             &local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"0.000000001\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_6a8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6a0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_6a8,
                                                             0x19e);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_6b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6b0 = "";
                                                  local_6c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_6c0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_31.m_end = pvVar4;
                                                  msg_31.m_begin = pvVar2;
                                                  file_31.m_end = (iterator)0x1a1;
                                                  file_31.m_begin = (iterator)&local_6b8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_31,
                                                             (size_t)&local_6c8,msg_31);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_6d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6d0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_6d8,
                                                             0x1a1);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_6e8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6e0 = "";
                                                  local_6f8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_6f0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_32.m_end = pvVar4;
                                                  msg_32.m_begin = pvVar2;
                                                  file_32.m_end = (iterator)0x1a2;
                                                  file_32.m_begin = (iterator)&local_6e8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_32,
                                                             (size_t)&local_6f8,msg_32);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58," ",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\" \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_708 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_700 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_708,
                                                             0x1a2);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_718 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_710 = "";
                                                  local_728 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_720 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_33.m_end = pvVar4;
                                                  msg_33.m_begin = pvVar2;
                                                  file_33.m_end = (iterator)0x1a3;
                                                  file_33.m_begin = (iterator)&local_718;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_33,
                                                             (size_t)&local_728,msg_33);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"  ",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"  \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_738 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_730 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_738,
                                                             0x1a3);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_748 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_740 = "";
                                                  local_758 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_750 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_34.m_end = pvVar4;
                                                  msg_34.m_begin = pvVar2;
                                                  file_34.m_end = (iterator)0x1a6;
                                                  file_34.m_begin = (iterator)&local_748;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_34,
                                                             (size_t)&local_758,msg_34);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"..",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"..\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_768 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_760 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_768,
                                                             0x1a6);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_778 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_770 = "";
                                                  local_788 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_780 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_35.m_end = pvVar4;
                                                  msg_35.m_begin = pvVar2;
                                                  file_35.m_end = (iterator)0x1a7;
                                                  file_35.m_begin = (iterator)&local_778;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_35,
                                                             (size_t)&local_788,msg_35);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"0..0",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"0..0\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_798 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_790 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_798,
                                                             0x1a7);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_7a8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7a0 = "";
                                                  local_7b8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_7b0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_36.m_end = pvVar4;
                                                  msg_36.m_begin = pvVar2;
                                                  file_36.m_end = (iterator)0x1a8;
                                                  file_36.m_begin = (iterator)&local_7a8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_36,
                                                             (size_t)&local_7b8,msg_36);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"1 2",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"1 2\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_7c8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7c0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_7c8,
                                                             0x1a8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_7d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7d0 = "";
                                                  local_7e8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_7e0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_37.m_end = pvVar4;
                                                  msg_37.m_begin = pvVar2;
                                                  file_37.m_end = (iterator)0x1a9;
                                                  file_37.m_begin = (iterator)&local_7d8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_37,
                                                             (size_t)&local_7e8,msg_37);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58," 1 2 ",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\" 1 2 \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_7f8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7f0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_7f8,
                                                             0x1a9);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_808 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_800 = "";
                                                  local_818 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_810 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_38.m_end = pvVar4;
                                                  msg_38.m_begin = pvVar2;
                                                  file_38.m_end = (iterator)0x1aa;
                                                  file_38.m_begin = (iterator)&local_808;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_38,
                                                             (size_t)&local_818,msg_38);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58," 1.2 3 ",&local_c1)
                                                  ;
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\" 1.2 3 \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_828 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_820 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_828,
                                                             0x1aa);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_838 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_830 = "";
                                                  local_848 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_840 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_39.m_end = pvVar4;
                                                  msg_39.m_begin = pvVar2;
                                                  file_39.m_end = (iterator)0x1ab;
                                                  file_39.m_begin = (iterator)&local_838;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_39,
                                                             (size_t)&local_848,msg_39);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58," 1 2.3 ",&local_c1)
                                                  ;
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\" 1 2.3 \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_858 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_850 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_858,
                                                             0x1ab);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_868 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_860 = "";
                                                  local_878 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_870 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_40.m_end = pvVar4;
                                                  msg_40.m_begin = pvVar2;
                                                  file_40.m_end = (iterator)0x1ae;
                                                  file_40.m_begin = (iterator)&local_868;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_40,
                                                             (size_t)&local_878,msg_40);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58," -1 .2  ",&local_c1
                                                            );
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\" -1 .2  \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_888 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_880 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_888,
                                                             0x1ae);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_898 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_890 = "";
                                                  local_8a8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_8a0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_41.m_end = pvVar4;
                                                  msg_41.m_begin = pvVar2;
                                                  file_41.m_end = (iterator)0x1af;
                                                  file_41.m_begin = (iterator)&local_898;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_41,
                                                             (size_t)&local_8a8,msg_41);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"  1 .2  ",&local_c1
                                                            );
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"  1 .2  \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_8b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_8b0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_8b8,
                                                             0x1af);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_8c8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_8c0 = "";
                                                  local_8d8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_8d0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_42.m_end = pvVar4;
                                                  msg_42.m_begin = pvVar2;
                                                  file_42.m_end = (iterator)0x1b0;
                                                  file_42.m_begin = (iterator)&local_8c8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_42,
                                                             (size_t)&local_8d8,msg_42);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58," +1 .2  ",&local_c1
                                                            );
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\" +1 .2  \")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_8e8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_8e0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_8e8,
                                                             0x1b0);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_8f8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_8f0 = "";
                                                  local_908 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_900 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_43.m_end = pvVar4;
                                                  msg_43.m_begin = pvVar2;
                                                  file_43.m_end = (iterator)0x1b3;
                                                  file_43.m_begin = (iterator)&local_8f8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_43,
                                                             (size_t)&local_908,msg_43);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,
                                                             "92233720368.54775808",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = 
                                                  "!ParseMoney(\"92233720368.54775808\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_918 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_910 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_918,
                                                             0x1b3);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_928 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_920 = "";
                                                  local_938 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_930 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_44.m_end = pvVar4;
                                                  msg_44.m_begin = pvVar2;
                                                  file_44.m_end = (iterator)0x1b6;
                                                  file_44.m_begin = (iterator)&local_928;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_44,
                                                             (size_t)&local_938,msg_44);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_58,"-1",&local_c1);
                                                  oVar5 = ParseMoney((string *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"-1\")";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_948 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_940 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_948,
                                                             0x1b6);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_958 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_950 = "";
                                                  local_968 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_960 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_45.m_end = pvVar4;
                                                  msg_45.m_begin = pvVar2;
                                                  file_45.m_end = (iterator)0x1b9;
                                                  file_45.m_begin = (iterator)&local_958;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_45,
                                                             (size_t)&local_968,msg_45);
                                                  s_abi_cxx11_((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_58,"",3);
                                                  oVar5 = ParseMoney((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88 = (char *)0x0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"\\0-1\"s)";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_978 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_970 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_978,
                                                             0x1b9);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  local_988 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_980 = "";
                                                  local_998 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_990 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_46.m_end = pvVar4;
                                                  msg_46.m_begin = pvVar2;
                                                  file_46.m_end = (iterator)0x1ba;
                                                  file_46.m_begin = (iterator)&local_988;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_46,
                                                             (size_t)&local_998,msg_46);
                                                  oVar5 = ParseMoney(&
                                                  STRING_WITH_EMBEDDED_NULL_CHAR_abi_cxx11_);
                                                  local_78._0_8_ =
                                                       CONCAT71(local_78._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_78._8_8_ = (element_type *)0x0;
                                                  aStack_68._M_allocated_capacity = 0;
                                                  local_90 = (_Storage<long,_true>)0xc6a2ea;
                                                  local_88 = "";
                                                  local_58[8] = false;
                                                  local_58._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  local_48 = boost::unit_test::lazy_ostream::inst;
                                                  local_40 = &local_90;
                                                  local_9a8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_9a0 = "";
                                                  pvVar2 = &DAT_00000001;
                                                  pvVar4 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)local_78,
                                                             (lazy_ostream *)local_58,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_9a8,
                                                             0x1ba);
                                                  boost::detail::shared_count::~shared_count
                                                            ((shared_count *)
                                                             &aStack_68._M_allocated_capacity);
                                                  local_9b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_9b0 = "";
                                                  local_9c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_9c0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  msg_47.m_end = pvVar4;
                                                  msg_47.m_begin = pvVar2;
                                                  file_47.m_end = (iterator)0x1bb;
                                                  file_47.m_begin = (iterator)&local_9b8;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_47,
                                                             (size_t)&local_9c8,msg_47);
                                                  s_abi_cxx11_((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_58,"1",2);
                                                  oVar5 = ParseMoney((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_58);
                                                  local_90._M_value =
                                                       CONCAT71(local_90._M_value._1_7_,
                                                                ~oVar5.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_88._0_1_ = 0;
                                                  local_88._1_7_ = 0;
                                                  sStack_80.pi_ = (sp_counted_base *)0x0;
                                                  local_668 = "!ParseMoney(\"1\\0\"s)";
                                                  local_660 = "";
                                                  local_78._8_8_ =
                                                       local_78._8_8_ & 0xffffffffffffff00;
                                                  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
                                                  aStack_68._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  aStack_68._8_8_ = &local_668;
                                                  local_9d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_9d0 = "";
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)&local_90,
                                                             (lazy_ostream *)local_78,1,0,WARN,
                                                             (check_type)ppcVar6,(size_t)&local_9d8,
                                                             0x1bb);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_80);
                                                  std::__cxx11::string::~string((string *)local_58);
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                    return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseMoney)
{
    BOOST_CHECK_EQUAL(ParseMoney("0.0").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney("0.").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".0").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".6789").value(), 6789'0000);
    BOOST_CHECK_EQUAL(ParseMoney("12345.").value(), COIN * 12345);

    BOOST_CHECK_EQUAL(ParseMoney("12345.6789").value(), (COIN/10000)*123456789);

    BOOST_CHECK_EQUAL(ParseMoney("10000000.00").value(), COIN*10000000);
    BOOST_CHECK_EQUAL(ParseMoney("1000000.00").value(), COIN*1000000);
    BOOST_CHECK_EQUAL(ParseMoney("100000.00").value(), COIN*100000);
    BOOST_CHECK_EQUAL(ParseMoney("10000.00").value(), COIN*10000);
    BOOST_CHECK_EQUAL(ParseMoney("1000.00").value(), COIN*1000);
    BOOST_CHECK_EQUAL(ParseMoney("100.00").value(), COIN*100);
    BOOST_CHECK_EQUAL(ParseMoney("10.00").value(), COIN*10);
    BOOST_CHECK_EQUAL(ParseMoney("1.00").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("1").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("   1").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("1   ").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("  1 ").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("0.1").value(), COIN/10);
    BOOST_CHECK_EQUAL(ParseMoney("0.01").value(), COIN/100);
    BOOST_CHECK_EQUAL(ParseMoney("0.001").value(), COIN/1000);
    BOOST_CHECK_EQUAL(ParseMoney("0.0001").value(), COIN/10000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00001").value(), COIN/100000);
    BOOST_CHECK_EQUAL(ParseMoney("0.000001").value(), COIN/1000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.0000001").value(), COIN/10000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00000001").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney(" 0.00000001 ").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00000001 ").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney(" 0.00000001").value(), COIN/100000000);

    // Parsing amount that cannot be represented should fail
    BOOST_CHECK(!ParseMoney("100000000.00"));
    BOOST_CHECK(!ParseMoney("0.000000001"));

    // Parsing empty string should fail
    BOOST_CHECK(!ParseMoney(""));
    BOOST_CHECK(!ParseMoney(" "));
    BOOST_CHECK(!ParseMoney("  "));

    // Parsing two numbers should fail
    BOOST_CHECK(!ParseMoney(".."));
    BOOST_CHECK(!ParseMoney("0..0"));
    BOOST_CHECK(!ParseMoney("1 2"));
    BOOST_CHECK(!ParseMoney(" 1 2 "));
    BOOST_CHECK(!ParseMoney(" 1.2 3 "));
    BOOST_CHECK(!ParseMoney(" 1 2.3 "));

    // Embedded whitespace should fail
    BOOST_CHECK(!ParseMoney(" -1 .2  "));
    BOOST_CHECK(!ParseMoney("  1 .2  "));
    BOOST_CHECK(!ParseMoney(" +1 .2  "));

    // Attempted 63 bit overflow should fail
    BOOST_CHECK(!ParseMoney("92233720368.54775808"));

    // Parsing negative amounts must fail
    BOOST_CHECK(!ParseMoney("-1"));

    // Parsing strings with embedded NUL characters should fail
    BOOST_CHECK(!ParseMoney("\0-1"s));
    BOOST_CHECK(!ParseMoney(STRING_WITH_EMBEDDED_NULL_CHAR));
    BOOST_CHECK(!ParseMoney("1\0"s));
}